

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# default.cpp
# Opt level: O0

void fill_intl21(string *filename,int data,char delimeter)

{
  int iVar1;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
  __l;
  bool bVar2;
  _Ios_Openmode _Var3;
  int iVar4;
  int iVar5;
  istream *piVar6;
  long lVar7;
  mapped_type *pmVar8;
  char in_DL;
  int in_ESI;
  string *in_RDI;
  stringstream str;
  int cidx;
  int idx;
  string pair;
  string word;
  string line;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  cnt;
  ifstream file;
  key_type *__k;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff940;
  key_equal *in_stack_fffffffffffff948;
  hasher *in_stack_fffffffffffff950;
  int (*paaiVar9) [5] [5];
  size_type in_stack_fffffffffffff958;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *in_stack_fffffffffffff960;
  int (*paaaiVar10) [5] [5] [5];
  iterator in_stack_fffffffffffff968;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  *in_stack_fffffffffffff970;
  int (*paaaaiVar11) [8] [5] [5] [5];
  undefined4 in_stack_fffffffffffff980;
  undefined4 in_stack_fffffffffffff984;
  undefined8 ****local_5e0;
  stringstream local_5d0 [392];
  mapped_type local_448;
  int local_444;
  string local_440 [32];
  string local_420 [32];
  string local_400 [37];
  key_type local_3db [3];
  undefined4 local_3d8;
  undefined4 local_3d4;
  undefined4 local_3d0;
  undefined4 local_3cc;
  undefined4 local_3c8;
  undefined4 local_3c4;
  undefined4 local_3c0;
  undefined4 local_3ac;
  undefined1 ****local_3a8;
  undefined8 ***local_3a0 [5];
  undefined1 local_378 [40];
  undefined1 local_350 [40];
  undefined1 local_328 [40];
  undefined1 local_300 [40];
  undefined1 local_2d8 [40];
  undefined1 local_2b0 [40];
  undefined1 local_288 [40];
  undefined1 ****local_260;
  undefined8 local_258;
  istream local_218 [523];
  char local_d;
  int local_c;
  
  local_d = in_DL;
  local_c = in_ESI;
  std::ifstream::ifstream(local_218,in_RDI,_S_in);
  local_3a8 = (undefined1 ****)local_3a0;
  local_3ac = 0;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
  pair<const_char_(&)[3],_int,_true>
            (in_stack_fffffffffffff970,(char (*) [3])in_stack_fffffffffffff968,
             (int *)in_stack_fffffffffffff960);
  local_3a8 = (undefined1 ****)local_378;
  local_3c0 = 0;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
  pair<const_char_(&)[3],_int,_true>
            (in_stack_fffffffffffff970,(char (*) [3])in_stack_fffffffffffff968,
             (int *)in_stack_fffffffffffff960);
  local_3a8 = (undefined1 ****)local_350;
  local_3c4 = 0;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
  pair<const_char_(&)[3],_int,_true>
            (in_stack_fffffffffffff970,(char (*) [3])in_stack_fffffffffffff968,
             (int *)in_stack_fffffffffffff960);
  local_3a8 = (undefined1 ****)local_328;
  local_3c8 = 0;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
  pair<const_char_(&)[3],_int,_true>
            (in_stack_fffffffffffff970,(char (*) [3])in_stack_fffffffffffff968,
             (int *)in_stack_fffffffffffff960);
  local_3a8 = (undefined1 ****)local_300;
  local_3cc = 0;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
  pair<const_char_(&)[3],_int,_true>
            (in_stack_fffffffffffff970,(char (*) [3])in_stack_fffffffffffff968,
             (int *)in_stack_fffffffffffff960);
  local_3a8 = (undefined1 ****)local_2d8;
  local_3d0 = 0;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
  pair<const_char_(&)[3],_int,_true>
            (in_stack_fffffffffffff970,(char (*) [3])in_stack_fffffffffffff968,
             (int *)in_stack_fffffffffffff960);
  local_3a8 = (undefined1 ****)local_2b0;
  local_3d4 = 0;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
  pair<const_char_(&)[3],_int,_true>
            (in_stack_fffffffffffff970,(char (*) [3])in_stack_fffffffffffff968,
             (int *)in_stack_fffffffffffff960);
  local_3a8 = (undefined1 ****)local_288;
  local_3d8 = 0;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
  pair<const_char_(&)[3],_int,_true>
            (in_stack_fffffffffffff970,(char (*) [3])in_stack_fffffffffffff968,
             (int *)in_stack_fffffffffffff960);
  local_260 = (undefined1 ****)local_3a0;
  local_258 = 8;
  __k = local_3db;
  std::
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
  ::allocator((allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
               *)0x188612);
  __l._M_len = (size_type)in_stack_fffffffffffff970;
  __l._M_array = in_stack_fffffffffffff968;
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::unordered_map(in_stack_fffffffffffff960,__l,in_stack_fffffffffffff958,in_stack_fffffffffffff950,
                  in_stack_fffffffffffff948,
                  (allocator_type *)CONCAT44(in_stack_fffffffffffff984,in_stack_fffffffffffff980));
  std::
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
  ::~allocator((allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
                *)0x188660);
  local_5e0 = &local_260;
  do {
    local_5e0 = local_5e0 + -5;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
    ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
             *)0x188697);
  } while (local_5e0 != local_3a0);
  std::__cxx11::string::string(local_400);
  std::__cxx11::string::string(local_420);
  std::__cxx11::string::string(local_440);
  local_444 = 0;
  local_448 = 0;
  while( true ) {
    piVar6 = std::getline<char,std::char_traits<char>,std::allocator<char>>(local_218,local_400);
    bVar2 = std::ios::operator_cast_to_bool((ios *)(piVar6 + *(long *)(*(long *)piVar6 + -0x18)));
    if (!bVar2) break;
    _Var3 = std::operator|(_S_out,_S_in);
    std::__cxx11::stringstream::stringstream(local_5d0,local_400,_Var3);
    local_444 = 0;
    while( true ) {
      piVar6 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)local_5d0,local_420,local_d);
      bVar2 = std::ios::operator_cast_to_bool((ios *)(piVar6 + *(long *)(*(long *)piVar6 + -0x18)));
      if ((!bVar2) ||
         ((local_444 == 0 && (bVar2 = std::operator==(in_stack_fffffffffffff940,(char *)__k), bVar2)
          ))) break;
      if (local_444 == 0) {
        pmVar8 = std::
                 unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                 ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                               *)in_stack_fffffffffffff940,__k);
        local_448 = *pmVar8;
        std::__cxx11::string::operator=(local_440,local_420);
      }
      else if (local_c == 0) {
        iVar4 = std::__cxx11::stoi(in_stack_fffffffffffff940,(size_t *)__k,0);
        lVar7 = (long)local_448;
        pmVar8 = std::
                 unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                 ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                               *)in_stack_fffffffffffff940,__k);
        iVar5 = *pmVar8;
        pmVar8 = std::
                 unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                 ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                               *)in_stack_fffffffffffff940,__k);
        iVar1 = *pmVar8;
        pmVar8 = std::
                 unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                 ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                               *)in_stack_fffffffffffff940,__k);
        int21_37[lVar7][iVar5 / 0x19][(iVar1 / 5) % 5][*pmVar8 % 5][local_444 + -1] = iVar4;
      }
      else {
        iVar5 = std::__cxx11::stoi(in_stack_fffffffffffff940,(size_t *)__k,0);
        paaaaiVar11 = int21_dH + local_448;
        pmVar8 = std::
                 unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                 ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                               *)in_stack_fffffffffffff940,__k);
        paaaiVar10 = *paaaaiVar11 + *pmVar8 / 0x19;
        pmVar8 = std::
                 unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                 ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                               *)in_stack_fffffffffffff940,__k);
        paaiVar9 = *paaaiVar10 + (*pmVar8 / 5) % 5;
        pmVar8 = std::
                 unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                 ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                               *)in_stack_fffffffffffff940,__k);
        (*paaiVar9)[*pmVar8 % 5][local_444 + -1] = iVar5;
      }
      local_444 = local_444 + 1;
    }
    pmVar8 = std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                           *)in_stack_fffffffffffff940,__k);
    *pmVar8 = *pmVar8 + 1;
    std::__cxx11::stringstream::~stringstream(local_5d0);
  }
  std::__cxx11::string::~string(local_440);
  std::__cxx11::string::~string(local_420);
  std::__cxx11::string::~string(local_400);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                    *)0x188cb7);
  std::ifstream::~ifstream(local_218);
  return;
}

Assistant:

void fill_intl21(const string &filename, int data, char delimeter) {
    ifstream file(filename);
//    cout << data << endl;
    unordered_map<string, int> cnt = {
            {"NP", 0},
            {"CG", 0},
            {"GC", 0},
            {"GU", 0},
            {"UG", 0},
            {"AU", 0},
            {"UA", 0},
            {"NN", 0}
    };

    string line, word, pair;
    int idx = 0, cidx = 0;

    while (getline(file, line)) {
        stringstream str(line);
        idx = 0;
        while(getline(str, word, delimeter)) {
            if (idx == 0 && word == "Pairs") break;
            if (idx == 0) {
                cidx = pair2pos[word];
                pair = word;
            } else {
                if (!data) {
                    int21_37[cidx][cnt[pair]/25][(cnt[pair]/5)%5][cnt[pair]%5][idx-1] = stoi(word);
                }
                else {
                    int21_dH[cidx][cnt[pair]/25][(cnt[pair]/5)%5][cnt[pair]%5][idx-1] = stoi(word);
                }
            }
            idx += 1;
        }
        cnt[pair] += 1;
    }
}